

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O1

void __thiscall HRSS_Random_Test::TestBody(HRSS_Random_Test *this)

{
  int iVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar3;
  char *in_R9;
  ScopedTrace gtest_trace_181;
  ScopedTrace gtest_trace_172;
  AssertionResult gtest_ar__2;
  uint8_t bit;
  AssertionResult gtest_ar__1;
  uint32_t offset;
  uint8_t shared_key2 [32];
  uint8_t shared_key [32];
  AssertionResult gtest_ar_;
  uint8_t encap_entropy [1400];
  HRSS_public_key pub;
  HRSS_private_key priv;
  uint8_t generate_key_entropy [1432];
  ScopedTrace local_1d02;
  ScopedTrace local_1d01;
  undefined1 local_1d00 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1cf8;
  byte local_1ce9;
  Bytes local_1ce8;
  undefined1 local_1cd8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1cc8;
  AssertHelper local_1cb8;
  int local_1cb0;
  uint local_1cac;
  string local_1ca8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c88 [4];
  undefined1 local_1c68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c60;
  string local_17e8 [44];
  HRSS_public_key local_1268;
  uchar *local_cd8;
  uint8_t local_cd0 [1800];
  uchar local_5c8 [1432];
  
  local_1cb0 = 0;
  do {
    RAND_bytes(local_5c8,0x598);
    local_cd0[0] = 0x98;
    local_cd0[1] = '\x05';
    local_cd0[2] = '\0';
    local_cd0[3] = '\0';
    local_cd0[4] = '\0';
    local_cd0[5] = '\0';
    local_cd0[6] = '\0';
    local_cd0[7] = '\0';
    local_cd8 = local_5c8;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_1d01,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xac,(Bytes *)&local_cd8);
    iVar1 = HRSS_generate_key(&local_1268,(HRSS_private_key *)&local_cd8,local_5c8);
    local_1c68[0] = iVar1 != 0;
    local_1c60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1c88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_17e8,(internal *)local_1c68,
                 (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1ca8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0xb0,local_17e8[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1ca8,(Message *)local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1ca8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_17e8[0]._M_dataplus._M_p != &local_17e8[0].field_2) {
        operator_delete(local_17e8[0]._M_dataplus._M_p,
                        local_17e8[0].field_2._M_allocated_capacity + 1);
      }
      if (local_1c88[0]._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_1c88[0]._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (local_1c60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c60,local_1c60);
      }
LAB_0031bed4:
      testing::ScopedTrace::~ScopedTrace(&local_1d01);
      return;
    }
    iVar1 = 10;
    do {
      RAND_bytes((uchar *)local_17e8,0x578);
      local_1c60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x578;
      local_1c68 = (undefined1  [8])local_17e8;
      testing::ScopedTrace::ScopedTrace<Bytes>
                (&local_1d02,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0xb5,(Bytes *)local_1c68);
      iVar2 = HRSS_encap((uint8_t *)local_1c68,(uint8_t *)local_1c88,&local_1268,
                         (uint8_t *)local_17e8);
      local_1cd8[0] = (internal)(iVar2 != 0);
      local_1cd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)local_1d00);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1ca8,(internal *)local_1cd8,
                   (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub, encap_entropy)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1ce8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xb9,local_1ca8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1ce8,(Message *)local_1d00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1ce8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ca8._M_dataplus._M_p != &local_1ca8.field_2) {
          operator_delete(local_1ca8._M_dataplus._M_p,local_1ca8.field_2._M_allocated_capacity + 1);
        }
        if (local_1d00 != (undefined1  [8])0x0) {
          (**(code **)((long)*(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d00 + 8))();
        }
        if (local_1cd0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1cd0;
          __ptr = local_1cd0;
LAB_0031bec5:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,__ptr);
        }
LAB_0031beca:
        testing::ScopedTrace::~ScopedTrace(&local_1d02);
        goto LAB_0031bed4;
      }
      iVar2 = HRSS_decap((uint8_t *)&local_1ca8,(HRSS_private_key *)&local_cd8,local_1c68,0x472);
      local_1d00[0] = iVar2 != 0;
      local_1cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_1ce8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1cd8,(internal *)local_1d00,
                   (AssertionResult *)
                   "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1cb8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xbd,(char *)CONCAT71(local_1cd8._1_7_,local_1cd8[0]));
        testing::internal::AssertHelper::operator=(&local_1cb8,(Message *)&local_1ce8);
LAB_0031be81:
        testing::internal::AssertHelper::~AssertHelper(&local_1cb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1cd8._1_7_,local_1cd8[0]) != &local_1cc8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_1cd8._1_7_,local_1cd8[0]),
                          local_1cc8._M_allocated_capacity + 1);
        }
        if ((string *)local_1ce8.span_.data_ != (string *)0x0) {
          (**(code **)(((_Alloc_hider *)local_1ce8.span_.data_)->_M_p + 8))();
        }
        if (local_1cf8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1cf8;
          __ptr = local_1cf8;
          goto LAB_0031bec5;
        }
        goto LAB_0031beca;
      }
      local_1d00 = (undefined1  [8])local_1c88;
      local_1cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
      local_1ce8.span_.data_ = (uchar *)&local_1ca8;
      local_1ce8.span_.size_ = 0x20;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_1cd8,"Bytes(shared_key)","Bytes(shared_key2)",(Bytes *)local_1d00
                 ,&local_1ce8);
      if (local_1cd8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1d00);
        pcVar3 = "";
        if (local_1cd0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar3 = (local_1cd0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1ce8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xbe,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1ce8,(Message *)local_1d00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1ce8);
        if (local_1d00 != (undefined1  [8])0x0) {
          (**(code **)((long)*(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d00 + 8))();
        }
      }
      if (local_1cd0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1cd0,local_1cd0);
      }
      RAND_bytes((uchar *)&local_1cac,4);
      RAND_bytes(&local_1ce9,1);
      local_1c68[local_1cac % 0x472] = local_1c68[local_1cac % 0x472] ^ '\x01' << (local_1ce9 & 7);
      iVar2 = HRSS_decap((uint8_t *)&local_1ca8,(HRSS_private_key *)&local_cd8,local_1c68,0x472);
      local_1d00[0] = iVar2 != 0;
      local_1cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_1ce8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1cd8,(internal *)local_1d00,
                   (AssertionResult *)
                   "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1cb8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xc6,(char *)CONCAT71(local_1cd8._1_7_,local_1cd8[0]));
        testing::internal::AssertHelper::operator=(&local_1cb8,(Message *)&local_1ce8);
        goto LAB_0031be81;
      }
      local_1d00 = (undefined1  [8])local_1c88;
      local_1cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_00000020;
      local_1ce8.span_.data_ = (uchar *)&local_1ca8;
      local_1ce8.span_.size_ = 0x20;
      testing::internal::CmpHelperNE<Bytes,Bytes>
                ((internal *)local_1cd8,"Bytes(shared_key)","Bytes(shared_key2)",(Bytes *)local_1d00
                 ,&local_1ce8);
      if (local_1cd8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1d00);
        pcVar3 = "";
        if (local_1cd0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar3 = (local_1cd0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1ce8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,199,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1ce8,(Message *)local_1d00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1ce8);
        if (local_1d00 != (undefined1  [8])0x0) {
          (**(code **)((long)*(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d00 + 8))();
        }
      }
      if (local_1cd0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1cd0,local_1cd0);
      }
      testing::ScopedTrace::~ScopedTrace(&local_1d02);
      if (iVar2 == 0) goto LAB_0031bed4;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    testing::ScopedTrace::~ScopedTrace(&local_1d01);
    local_1cb0 = local_1cb0 + 1;
    if (local_1cb0 == 10) {
      return;
    }
  } while( true );
}

Assistant:

TEST(HRSS, Random) {
  for (unsigned i = 0; i < 10; i++) {
    uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
    RAND_bytes(generate_key_entropy, sizeof(generate_key_entropy));
    SCOPED_TRACE(Bytes(generate_key_entropy));

    HRSS_public_key pub;
    HRSS_private_key priv;
    ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

    for (unsigned j = 0; j < 10; j++) {
      uint8_t encap_entropy[HRSS_ENCAP_BYTES];
      RAND_bytes(encap_entropy, sizeof(encap_entropy));
      SCOPED_TRACE(Bytes(encap_entropy));

      uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
      uint8_t shared_key[HRSS_KEY_BYTES];
      ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub, encap_entropy));

      uint8_t shared_key2[HRSS_KEY_BYTES];
      ASSERT_TRUE(
          HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));
      EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));

      uint32_t offset;
      RAND_bytes((uint8_t*) &offset, sizeof(offset));
      uint8_t bit;
      RAND_bytes(&bit, sizeof(bit));
      ciphertext[offset % sizeof(ciphertext)] ^= (1 << (bit & 7));
      ASSERT_TRUE(
          HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));
      EXPECT_NE(Bytes(shared_key), Bytes(shared_key2));
    }
  }
}